

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O3

void __thiscall pm::NRooks::shuffleYCoords(NRooks *this)

{
  float fVar1;
  pointer pVVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t max;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = (this->super_Sampler).numSets_;
  if (uVar4 != 0) {
    max = (this->super_Sampler).numSamples_;
    uVar5 = 0;
    do {
      uVar3 = 1;
      if (max != 1) {
        uVar4 = 0;
        do {
          uVar7 = uVar4 + 1;
          uVar6 = uVar4 + uVar5 * max + 1;
          uVar3 = Random::integer(&(this->super_Sampler).rnd_,0,max);
          max = (this->super_Sampler).numSamples_;
          uVar4 = max * uVar5 + uVar3;
          pVVar2 = (this->super_Sampler).samples_.
                   super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar1 = pVVar2[uVar6].y;
          pVVar2[uVar6].y = pVVar2[uVar4].y;
          pVVar2[uVar4].y = fVar1;
          uVar4 = uVar7;
        } while (uVar7 < max - 1);
        uVar4 = (this->super_Sampler).numSets_;
        uVar3 = max;
      }
      max = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void NRooks::shuffleYCoords()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_ - 1; i++)
		{
			const int unsigned source = i + p * numSamples_ + 1;
			const unsigned int target = rnd_.integer(0, numSamples_) + p * numSamples_;

			const float temp = samples_[source].y;
			samples_[source].y = samples_[target].y;
			samples_[target].y = temp;
		}
}